

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::IsValidGatherLodBiasAMD(ValidationState_t *_,Op opcode)

{
  Op opcode_local;
  ValidationState_t *__local;
  
  if ((opcode == OpImageGather) || (opcode == OpImageSparseGather)) {
    __local._7_1_ = ValidationState_t::HasCapability(_,CapabilityImageGatherBiasLodAMD);
  }
  else {
    __local._7_1_ = false;
  }
  return __local._7_1_;
}

Assistant:

bool IsValidGatherLodBiasAMD(const ValidationState_t& _, spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpImageGather:
    case spv::Op::OpImageSparseGather:
      return _.HasCapability(spv::Capability::ImageGatherBiasLodAMD);
    default:
      break;
  }
  return false;
}